

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O2

void IMU_JY61::ParseData(char chr,long time_base)

{
  undefined7 uVar1;
  char cVar2;
  ulong uVar3;
  ostream *poVar4;
  float *pfVar5;
  byte bVar6;
  short *psVar7;
  long lVar8;
  char *__format;
  undefined8 local_30;
  short sData [4];
  
  uVar3 = (ulong)ParseData::chrCnt;
  bVar6 = ParseData::chrCnt + 1;
  ParseData::chrCnt = bVar6;
  ParseData::chrBuf[uVar3] = chr;
  cVar2 = ParseData::chrBuf[1];
  if (bVar6 < 0xb) {
    return;
  }
  if ((~ParseData::chrBuf[1] & 0x50U) != 0 || ParseData::chrBuf[0] != 'U') {
    printf("Error:%x %x\r\n",(ulong)(uint)(int)ParseData::chrBuf[0],
           (ulong)(uint)(int)ParseData::chrBuf[1]);
    ParseData::chrBuf[0] = ParseData::chrBuf[1];
    uVar1 = CONCAT61(ParseData::chrBuf._2_6_,ParseData::chrBuf[1]);
    ParseData::chrBuf[1] = (char)ParseData::chrBuf._2_6_;
    ParseData::chrBuf._2_6_ = (undefined6)(CONCAT17(ParseData::chrBuf[8],uVar1) >> 0x10);
    ParseData::chrBuf[8] = ParseData::chrBuf[9];
    ParseData::chrBuf[9] = ParseData::chrBuf[10];
    ParseData::chrCnt = ParseData::chrCnt + 0xff;
    return;
  }
  local_30 = CONCAT17(ParseData::chrBuf[9],CONCAT16(ParseData::chrBuf[8],ParseData::chrBuf._2_6_));
  *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 5;
  switch(cVar2) {
  case 'Q':
    fflush(_stdout);
    setvbuf(_stdout,(char *)0x0,2,0);
    freopen("../imu_acc.mat","a",_stdout);
    lVar8 = getTimeToBase(time_base);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)lVar8 * 0.0001);
    std::operator<<(poVar4," ");
    psVar7 = (short *)&local_30;
    __format = "%6.3f %6.3f %6.3f\n";
    pfVar5 = (float *)&a;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(float *)((long)&a + lVar8) = (float)(int)*psVar7 * 3.0517578e-05 * 16.0;
      psVar7 = psVar7 + 1;
    }
    break;
  case 'R':
    fflush(_stdout);
    setvbuf(_stdout,(char *)0x0,2,0);
    freopen("../imu_gyo.mat","a",_stdout);
    lVar8 = getTimeToBase(time_base);
    poVar4 = std::operator<<((ostream *)&std::cout,"");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)lVar8 * 0.0001);
    std::operator<<(poVar4," ");
    psVar7 = (short *)&local_30;
    __format = "%7.3f %7.3f %7.3f\n";
    pfVar5 = (float *)&w;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(float *)((long)&w + lVar8) = (float)(int)*psVar7 * 3.0517578e-05 * 2000.0;
      psVar7 = psVar7 + 1;
    }
    break;
  case 'S':
    fflush(_stdout);
    setvbuf(_stdout,(char *)0x0,2,0);
    freopen("imu_angle.mat","a",_stdout);
    lVar8 = getTimeToBase(time_base);
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 5;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(float)lVar8 * 0.0001);
    std::operator<<(poVar4," ");
    psVar7 = (short *)&local_30;
    __format = "%7.3f %7.3f %7.3f ";
    pfVar5 = (float *)&Angle;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(float *)((long)&Angle + lVar8) = (float)(int)*psVar7 * 3.0517578e-05 * 180.0;
      psVar7 = psVar7 + 1;
    }
    break;
  case 'T':
    psVar7 = (short *)&local_30;
    __format = "h:%4.0f %4.0f %4.0f ";
    pfVar5 = (float *)&h;
    for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
      *(float *)((long)&h + lVar8) = (float)(int)*psVar7;
      psVar7 = psVar7 + 1;
    }
    break;
  default:
    goto switchD_00103d22_default;
  }
  printf(__format,(double)*pfVar5,(double)pfVar5[1],(double)pfVar5[2]);
switchD_00103d22_default:
  ParseData::chrCnt = '\0';
  return;
}

Assistant:

void ParseData(char chr,long time_base)
    {
        static char chrBuf[100];
        static unsigned char chrCnt=0;
        signed short sData[4];
        unsigned char i;

        time_t now;
        chrBuf[chrCnt++]=chr;
        if (chrCnt<11) return;

        if ((chrBuf[0]!=0x55)||((chrBuf[1]&0x50)!=0x50)) {printf("Error:%x %x\r\n",chrBuf[0],chrBuf[1]);memcpy(&chrBuf[0],&chrBuf[1],10);chrCnt--;return;}

        memcpy(&sData[0],&chrBuf[2],8);

//        fflush(stdout);
//        setvbuf(stdout,NULL,_IONBF,0);
//        freopen("../imu_data.txt","a",stdout);

       std::cout.precision(5);

        switch(chrBuf[1])
        {
            case 0x51:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("../imu_acc.mat","a",stdout);

                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    a[i] = (float)sData[i]/32768.0*16.0;

                    //qxiaofan
                    //a[i] = (float)sData[i] * 16.0;
                }

                //time(&now);
                //printf("\r\nT:%s a:%6.3f %6.3f %6.3f ",asctime(localtime(&now)),a[0],a[1],a[2]);
                printf("%6.3f %6.3f %6.3f\n",a[0],a[1],a[2]);
            }
                break;
            case 0x52:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("../imu_gyo.mat","a",stdout);
                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout<<""<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    w[i] = (float)sData[i]/32768.0*2000.0;

                    //qxiaofan
                    //w[i] = (float)sData[i]*2000.0;
                }
                printf("%7.3f %7.3f %7.3f\n",w[0],w[1],w[2]);
            }

                break;
            case 0x53:
            {
                fflush(stdout);
                setvbuf(stdout,NULL,_IONBF,0);
                freopen("imu_angle.mat","a",stdout);
                long time = getTimeToBase(time_base);
                float time_dist =float(time)*0.0001;
                std::cout.precision(5);
                std::cout<<time_dist<<" ";
                for (i=0;i<3;i++)
                {
                    //src
                    Angle[i] = (float)sData[i]/32768.0*180.0;

                    //qxiaofan
                    //Angle[i] = (float)sData[i] * 180.0;
                }
                printf("%7.3f %7.3f %7.3f ",Angle[0],Angle[1],Angle[2]);

            }

                break;
            case 0x54:
                for (i=0;i<3;i++) h[i] = (float)sData[i];
                printf("h:%4.0f %4.0f %4.0f ",h[0],h[1],h[2]);

                break;
        }
        chrCnt=0;
    }